

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stealth_strategy.cpp
# Opt level: O2

void __thiscall
StealthStrategy::generateActions(StealthStrategy *this,PlayerSight *sight,Actions *actions)

{
  bool bVar1;
  float fVar2;
  int iVar3;
  Randomizer *this_00;
  int *piVar4;
  Router *this_01;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec2 pos;
  Vec2 pos_00;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar15;
  undefined8 uVar14;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  if (this->field_0xc == '\0') {
    if (((sight->hp <= this->hp_lower_bound) && (sight->canSuckAttack == true)) &&
       (0 < sight->unitInSightCount)) {
      fVar6 = (sight->pos).x;
      fVar9 = (sight->pos).y;
      fVar12 = 1e+08;
      fVar13 = 1e+08;
      fVar10 = 0.0;
      fVar11 = 0.0;
      iVar5 = -1;
      bVar1 = false;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar7 = fVar12;
      fVar8 = fVar13;
      for (piVar4 = *(int **)&sight->unitInSight; piVar4 != *(int **)&sight->field_0x80;
          piVar4 = piVar4 + 5) {
        uVar14 = *(undefined8 *)(piVar4 + 1);
        uVar16 = *(undefined8 *)(piVar4 + 3);
        fVar15 = (float)((ulong)uVar14 >> 0x20);
        fVar18 = (float)uVar14 - fVar6;
        fVar17 = fVar15 - fVar9;
        fVar19 = fVar18 * fVar18 + fVar17 * fVar17;
        fVar17 = (float)uVar16;
        fVar18 = (float)((ulong)uVar16 >> 0x20);
        fVar2 = (float)uVar14;
        if ((fVar12 - fVar6) * (fVar12 - fVar6) + (fVar13 - fVar9) * (fVar13 - fVar9) <= fVar19) {
          fVar17 = fVar7;
          fVar18 = fVar8;
          fVar2 = fVar12;
          fVar15 = fVar13;
        }
        fVar13 = fVar15;
        fVar12 = fVar2;
        if (SQRT(fVar19) <= 4.0) {
          iVar3 = *piVar4;
          if (bVar1) {
            if (fVar19 <= (fVar10 - fVar6) * (fVar10 - fVar6) + (fVar11 - fVar9) * (fVar11 - fVar9))
            goto LAB_001060cf;
          }
          else {
            bVar1 = true;
          }
        }
        else {
LAB_001060cf:
          uVar14 = CONCAT44(fVar11,fVar10);
          uVar16 = CONCAT44(fVar21,fVar20);
          iVar3 = iVar5;
        }
        iVar5 = iVar3;
        fVar10 = (float)uVar14;
        fVar11 = (float)((ulong)uVar14 >> 0x20);
        fVar20 = (float)uVar16;
        fVar21 = (float)((ulong)uVar16 >> 0x20);
        fVar7 = fVar17;
        fVar8 = fVar18;
      }
      if (bVar1) {
        pos.y = fVar11;
        pos.x = fVar10;
        Actions::emplace(actions,SuckAttack,iVar5,pos);
        iVar5 = sight->id;
        pos_00.x = (sight->pos).x + fVar20 * -10.0;
        pos_00.y = (sight->pos).y + fVar21 * -10.0;
      }
      else {
        iVar5 = sight->id;
        pos_00.x = fVar7 + fVar12;
        pos_00.y = fVar8 + fVar13;
      }
LAB_0010617b:
      Actions::emplace(actions,SelectDestination,iVar5,pos_00);
      return;
    }
    fVar9 = 0.0 - (sight->velocity).x;
    fVar6 = 0.0 - (sight->velocity).y;
    if (fVar9 * fVar9 + fVar6 * fVar6 < 0.0001) {
      if (this->status == ssStandby) {
        if (this->activeRound <= sight->round) {
          this->status = ssWalking;
          this->activeRound = 0;
          iVar5 = sight->id;
          this_01 = Router::getInstance();
          pos_00 = Router::availablePosition(this_01);
          goto LAB_0010617b;
        }
      }
      else if (this->status == ssWalking) {
        this->status = ssStandby;
        iVar5 = sight->round;
        this_00 = Randomizer::getInstance();
        iVar3 = Randomizer::randWaitTime(this_00);
        this->activeRound = iVar3 + iVar5;
      }
    }
  }
  return;
}

Assistant:

void StealthStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (sight.hp <= hp_lower_bound && sight.canSuckAttack && sight.unitInSightCount > 0)
    {
        PUnitInfo nearest, choice;
        nearest.pos = Vec2(FINF, FINF);
        nearest.velocity = Vec2(FINF, FINF);
        bool found = false;
        for (auto uinfo : sight.unitInSight) {
            if ((nearest.pos - sight.pos).len2() > (uinfo.pos - sight.pos).len2())
                nearest = uinfo;
            if ((uinfo.pos - sight.pos).length() <= SuckRange) {
                if (!found) {
                    found = true;
                    choice = uinfo;
                } else if ((choice.pos - sight.pos).len2() < (uinfo.pos - sight.pos).len2())
                    choice = uinfo;
            }
        }

        if (sight.unitInSightCount != 0)
        {
            if (!found)
                actions->emplace(SelectDestination, sight.id, nearest.pos + nearest.velocity);
            else
            {
                actions->emplace(SuckAttack, choice.id, choice.pos);
                actions->emplace(SelectDestination, sight.id, sight.pos - (choice.velocity * 10.));
            }
            return;
        }
    }
    if (sight.velocity == Vec2())
    {
        if (status == ssWalking)    //开始等待
        {
            status = ssStandby;
            activeRound = sight.round + Randomizer::getInstance()->randWaitTime();
        }
        else if (status == ssStandby && sight.round >= activeRound)
        {
            status = ssWalking;
            activeRound = 0;
            actions->emplace(SelectDestination, sight.id, Router::getInstance()->availablePosition());
        }
    }
}